

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O2

void __thiscall RotSpaceConstructor::test_method(RotSpaceConstructor *this)

{
  undefined **local_1d8;
  undefined1 local_1d0;
  undefined8 *local_1c8;
  char **local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  shared_count sStack_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  SO3<mnf::ExpMapQuaternion> S;
  
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&S);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x2d);
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_00153ad0;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = (char **)0x13f2c4;
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_178 = "";
  local_1a8 = mnf::Manifold::dim();
  local_1b8._0_4_ = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_1d8,&local_180,0x2d,1,2,&local_1a8,"S.dim()",&local_1b8,"3");
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x2e);
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_00153ad0;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = (char **)0x13f2c4;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_188 = "";
  local_1a8 = mnf::Manifold::representationDim();
  local_1b8._0_4_ = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_1d8,&local_190,0x2e,1,2,&local_1a8,"S.representationDim()",&local_1b8,"4");
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x2f);
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_00153ad0;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_1c0 = (char **)0x13f2c4;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_138 = "";
  local_1a8 = 1;
  local_1b8 = (char *)CONCAT44(local_1b8._4_4_,1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_1d8,&local_140,0x2f,1,2,&local_1a8,"S.numberOfSubManifolds()",&local_1b8,"1");
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x30);
  local_1a8 = CONCAT71(local_1a8._1_7_,1);
  local_1a0 = 0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_1b8 = "S.isElementary()";
  local_1b0 = "";
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_00153be0;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_168 = "";
  local_1c0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_198);
  mnf::SO3<mnf::ExpMapQuaternion>::~SO3(&S);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RotSpaceConstructor)
{
  SO3<ExpMapQuaternion> S;
  BOOST_CHECK_EQUAL(S.dim(), 3);
  BOOST_CHECK_EQUAL(S.representationDim(), 4);
  BOOST_CHECK_EQUAL(S.numberOfSubManifolds(), 1);
  BOOST_CHECK(S.isElementary());
}